

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::operator=(QString *this,QLatin1StringView other)

{
  __atomic_base<int> _Var1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char *str;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  str = (char *)other.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d;
  if (pDVar4 == (Data *)0x0) {
    qVar5 = 0;
  }
  else {
    qVar5 = (pDVar4->super_QArrayData).alloc;
  }
  qVar3 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(&this->d);
  pDVar4 = (this->d).d;
  if (((pDVar4 == (Data *)0x0) ||
      (_Var1._M_i = (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i,
      pDVar4 = (Data *)(ulong)(uint)_Var1._M_i, _Var1._M_i != 1)) || (qVar5 - qVar3 < (long)str)) {
    fromLatin1((QString *)&local_48,(QString *)other.m_data,str,(qsizetype)pDVar4);
    pDVar4 = (this->d).d;
    pcVar2 = (this->d).ptr;
    (this->d).d = local_48.d;
    (this->d).ptr = local_48.ptr;
    qVar5 = (this->d).size;
    (this->d).size = local_48.size;
    local_48.d = pDVar4;
    local_48.ptr = pcVar2;
    local_48.size = qVar5;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  else {
    (this->d).size = (qsizetype)str;
    pcVar2 = (this->d).ptr;
    pcVar2[(long)str] = L'\0';
    qt_from_latin1(pcVar2,other.m_data,(size_t)str);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::operator=(QLatin1StringView other)
{
    const qsizetype capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (isDetached() && other.size() <= capacityAtEnd) { // assumes d->alloc == 0 -> !isDetached() (sharedNull)
        d.size = other.size();
        d.data()[other.size()] = 0;
        qt_from_latin1(d.data(), other.latin1(), other.size());
    } else {
        *this = fromLatin1(other.latin1(), other.size());
    }
    return *this;
}